

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::Brick_ForceAnalytical::Brick_ForceAnalytical
          (Brick_ForceAnalytical *this,ChMatrixNM<double,_8,_3> *d_,ChMatrixNM<double,_8,_3> *d0_,
          ChElementHexaANCF_3813 *element_,ChMatrixNM<double,_6,_6> *T0_,double *detJ0C_,
          ChVectorN<double,_9> *alpha_eas_,double *E_,double *v_)

{
  ActualDstType actualDst;
  undefined1 auVar1 [64];
  
  (this->super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>)._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_00b5d560;
  this->element = element_;
  this->d = d_;
  this->d0 = d0_;
  this->T0 = T0_;
  this->alpha_eas = alpha_eas_;
  this->detJ0C = detJ0C_;
  this->E = E_;
  this->v = v_;
  auVar1 = ZEXT864(0) << 0x20;
  *(undefined1 (*) [64])
   (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       = auVar1;
  *(undefined1 (*) [64])
   ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array + 8) = auVar1;
  *(undefined1 (*) [64])
   ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array + 0x10) = auVar1;
  *(undefined1 (*) [64])
   ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array + 0x18) = auVar1;
  *(undefined1 (*) [64])
   ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array + 0x1c) = auVar1;
  memset(&this->Gd,0,0x6c0);
  memset(&this->Sigm,0,0x288);
  memset(&this->Sx,0,0x6c0);
  return;
}

Assistant:

Brick_ForceAnalytical::Brick_ForceAnalytical(ChMatrixNM<double, 8, 3>* d_,
                                             ChMatrixNM<double, 8, 3>* d0_,
                                             ChElementHexaANCF_3813* element_,
                                             ChMatrixNM<double, 6, 6>* T0_,
                                             double* detJ0C_,
                                             ChVectorN<double, 9>* alpha_eas_,
                                             double* E_,
                                             double* v_)
    : element(element_), d(d_), d0(d0_), T0(T0_), alpha_eas(alpha_eas_), detJ0C(detJ0C_), E(E_), v(v_) {
    E_eps.setZero();
    Gd.setZero();
    Sigm.setZero();

    Sx.setZero();
    Sy.setZero();
    Sz.setZero();
}